

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::ResultBuilder::allowThrows(ResultBuilder *this)

{
  int iVar1;
  IConfig *in_RAX;
  IMutableContext *pIVar2;
  Ptr<const_Catch::IConfig> local_18;
  
  local_18.m_p = in_RAX;
  pIVar2 = getCurrentMutableContext();
  (*(pIVar2->super_IContext)._vptr_IContext[6])(&local_18,pIVar2);
  iVar1 = (*((local_18.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])();
  Ptr<const_Catch::IConfig>::~Ptr(&local_18);
  return SUB41(iVar1,0);
}

Assistant:

bool ResultBuilder::allowThrows() const { return getCurrentContext().getConfig()->allowThrows(); }